

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# binary-reader-interp.cc
# Opt level: O2

Result __thiscall
wabt::interp::anon_unknown_0::BinaryReaderInterp::OnTableInitExpr
          (BinaryReaderInterp *this,Index segment_index,Index table_index)

{
  Result RVar1;
  Location LStack_108;
  Location local_e8;
  Var local_c0;
  Var local_78;
  
  local_e8.field_1.field_0.line = 0;
  local_e8.field_1._4_8_ = 0;
  local_e8.filename.data_ = (char *)0x0;
  local_e8.filename.size_._0_4_ = 0;
  local_e8.filename.size_._4_4_ = 0;
  Var::Var(&local_78,segment_index,&local_e8);
  LStack_108.field_1.field_0.line = 0;
  LStack_108.field_1._4_8_ = 0;
  LStack_108.filename.data_ = (char *)0x0;
  LStack_108.filename.size_._0_4_ = 0;
  LStack_108.filename.size_._4_4_ = 0;
  Var::Var(&local_c0,table_index,&LStack_108);
  RVar1 = SharedValidator::OnTableInit
                    (&this->validator_,(Location *)(anonymous_namespace)::BinaryReaderInterp::loc,
                     &local_78,&local_c0);
  Var::~Var(&local_c0);
  Var::~Var(&local_78);
  if (RVar1.enum_ != Error) {
    Istream::Emit(this->istream_,TableInit,table_index,segment_index);
  }
  return (Result)(uint)(RVar1.enum_ == Error);
}

Assistant:

Result BinaryReaderInterp::OnTableInitExpr(Index segment_index,
                                           Index table_index) {
  CHECK_RESULT(
      validator_.OnTableInit(loc, Var(segment_index), Var(table_index)));
  istream_.Emit(Opcode::TableInit, table_index, segment_index);
  return Result::Ok;
}